

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O2

int8_t __thiscall create::Create::getTemperature(Create *this)

{
  bool bVar1;
  int8_t iVar2;
  ostream *poVar4;
  Packet *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  uint16_t uVar3;
  
  bVar1 = Data::isValidPacketID
                    ((this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,'\x18');
  if (bVar1) {
    Data::getPacket((Data *)&local_18,
                    (uint8_t)(this->data).
                             super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    uVar3 = Packet::getData(local_18);
    iVar2 = (int8_t)uVar3;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"[create::Create] ");
    poVar4 = std::operator<<(poVar4,"Temperature sensor not supported!");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar2 = '\0';
  }
  return iVar2;
}

Assistant:

int8_t Create::getTemperature() const {
    if (data->isValidPacketID(ID_TEMP)) {
      return (int8_t) GET_DATA(ID_TEMP);
    }
    else {
      CERR("[create::Create] ", "Temperature sensor not supported!");
      return 0;
    }
  }